

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_htmlspecialchars(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  byte *zString;
  int iVar3;
  int iVar4;
  char *zString_00;
  jx9_value *pjVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  int nLen;
  undefined8 local_38;
  
  local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    zString = (byte *)jx9_value_to_string(*apArg,(int *)((long)&local_38 + 4));
    iVar4 = local_38._4_4_;
    lVar6 = (long)local_38._4_4_;
    local_38 = CONCAT44(local_38._4_4_,0x41);
    if (nArg != 1) {
      pjVar5 = apArg[1];
      jx9MemObjToInteger(pjVar5);
      iVar2 = *(int *)&pjVar5->x;
      iVar3 = 0x41;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      local_38 = CONCAT44(local_38._4_4_,iVar3);
    }
    if (0 < iVar4) {
      pbVar7 = zString + lVar6;
      do {
        bVar9 = true;
        pbVar8 = zString;
        do {
          if (((ulong)*pbVar8 < 0x3f) && ((0x500000c400000000U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)
             ) break;
          pbVar8 = pbVar8 + 1;
          bVar9 = pbVar8 < pbVar7;
        } while (bVar9);
        if (zString < pbVar8) {
          jx9_value_string(pCtx->pRet,(char *)zString,(int)pbVar8 - (int)zString);
        }
        if (!bVar9) {
          return 0;
        }
        bVar1 = *pbVar8;
        if (bVar1 < 0x27) {
          if (bVar1 == 0x22) {
            if ((local_38 & 4) == 0) {
              pjVar5 = pCtx->pRet;
              zString_00 = "&quot;";
              goto LAB_0013050b;
            }
            pjVar5 = pCtx->pRet;
            zString_00 = "\"";
LAB_0013051d:
            iVar4 = 1;
            goto LAB_00130522;
          }
          if (bVar1 == 0x26) {
            pjVar5 = pCtx->pRet;
            zString_00 = "&amp;";
            iVar4 = 5;
            goto LAB_00130522;
          }
        }
        else {
          if (bVar1 == 0x27) {
            if ((local_38 & 2) == 0) {
              pjVar5 = pCtx->pRet;
              zString_00 = "\'";
              goto LAB_0013051d;
            }
            pjVar5 = pCtx->pRet;
            zString_00 = "&#039;";
LAB_0013050b:
            iVar4 = 6;
          }
          else {
            if (bVar1 == 0x3c) {
              pjVar5 = pCtx->pRet;
              zString_00 = "&lt;";
            }
            else {
              if (bVar1 != 0x3e) goto LAB_00130527;
              pjVar5 = pCtx->pRet;
              zString_00 = "&gt;";
            }
            iVar4 = 4;
          }
LAB_00130522:
          jx9_value_string(pjVar5,zString_00,iVar4);
        }
LAB_00130527:
        zString = pbVar8 + 1;
      } while (zString < pbVar7);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01|0x40; /* ENT_COMPAT | ENT_HTML401 */
	int nLen, c;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01|0x40;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' && zIn[0] != '\'' && zIn[0] != '"' && zIn[0] != '<' && zIn[0] != '>' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			break;
		}
		c = zIn[0];
		if( c == '&' ){
			/* Expand '&amp;' */
			jx9_result_string(pCtx, "&amp;", (int)sizeof("&amp;")-1);
		}else if( c == '<' ){
			/* Expand '&lt;' */
			jx9_result_string(pCtx, "&lt;", (int)sizeof("&lt;")-1);
		}else if( c == '>' ){
			/* Expand '&gt;' */
			jx9_result_string(pCtx, "&gt;", (int)sizeof("&gt;")-1);
		}else if( c == '\'' ){
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand '&#039;' */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}else{
				/* Leave the single quote untouched */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}
		}else if( c == '"' ){
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				/* Expand '&quot;' */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}else{
				/* Leave the double quote untouched */
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}
		}
		/* Ignore the unsafe HTML character */
		zIn++;
	}
	return JX9_OK;
}